

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

string * __thiscall
gmath::Camera::getCameraKey_abi_cxx11_(string *__return_storage_ptr__,Camera *this,char *key,int id)

{
  ostream *poVar1;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::operator<<((ostream *)&os,"camera.");
  if (-1 < id) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&os,id);
    std::operator<<(poVar1,'.');
  }
  std::operator<<((ostream *)&os,key);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

std::string Camera::getCameraKey(const char *key, int id) const
{
  std::ostringstream os;

  os << "camera.";

  if (id >= 0)
  {
    os << id << '.';
  }

  os << key;

  return os.str();
}